

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgtool.cpp
# Opt level: O1

int convert(int argc,char **argv)

{
  _Base_ptr p_Var1;
  _Rb_tree_header *p_Var2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  polymorphic_allocator<float> pVar16;
  aligned_storage_t<sizeof(float),_alignof(float)> format;
  bool bVar17;
  bool bVar18;
  int iVar19;
  int iVar20;
  Allocator AVar21;
  ulong uVar22;
  aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)> to;
  anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
  *paVar23;
  size_t *psVar24;
  InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *pIVar25;
  size_type sVar26;
  size_t sVar27;
  int i;
  Point2i p;
  ImageChannelValues *__it2;
  ImageChannelValues *__it2_00;
  ImageChannelValues *extraout_RDX;
  ImageChannelValues *__it2_01;
  ImageChannelValues *extraout_RDX_00;
  ImageChannelValues *extraout_RDX_01;
  ImageChannelValues *extraout_RDX_02;
  ImageChannelValues *extraout_RDX_03;
  ImageChannelValues *extraout_RDX_04;
  ImageChannelValues *extraout_RDX_05;
  ImageChannelValues *extraout_RDX_06;
  ImageChannelValues *extraout_RDX_07;
  ImageChannelValues *pIVar28;
  ImageChannelValues *pIVar29;
  ImageChannelValues *extraout_RDX_08;
  ImageChannelValues *extraout_RDX_09;
  ImageChannelValues *extraout_RDX_10;
  uint uVar30;
  string *name;
  optional<float> oVar31;
  long lVar32;
  InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *pIVar33;
  InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *pIVar34;
  InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *pIVar35;
  int c;
  int iVar36;
  int iVar37;
  aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)> from;
  float *pfVar38;
  long lVar39;
  char *pcVar40;
  char ch;
  undefined8 *in_R8;
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  *in_R9;
  int iVar41;
  ulong uVar42;
  size_t sVar43;
  undefined1 *puVar44;
  int iVar45;
  Point2i PVar46;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar47;
  undefined1 auVar48 [8];
  _Alloc_hider _Var49;
  Float FVar50;
  float fVar51;
  undefined1 auVar53 [16];
  float fVar52;
  undefined1 extraout_var [60];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [16];
  undefined1 auVar57 [64];
  undefined1 in_XMM3 [16];
  string_view str;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels_00;
  span<int> out;
  span<const_float> values;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels_00;
  bool bw;
  bool preserveColors;
  bool tonemap;
  bool flipy;
  bool acesFilmic;
  ImageChannelDesc desc;
  int repeat;
  float scale;
  Float despikeLimit;
  Float maxY;
  float gamma;
  array<int,_4UL> cropWindow;
  ImageChannelValues channels;
  string channelNames;
  vector<pbrt::ImageChannelValues,_std::allocator<pbrt::ImageChannelValues>_> neighbors;
  string inFile;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  splitChannelNames;
  string colorspace;
  string outFile;
  ulong local_b00;
  InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *local_af8;
  ulong local_af0;
  uint local_ae0;
  aligned_storage_t<sizeof(float),_alignof(float)> aStack_adc;
  InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *local_ac0;
  bool local_aad;
  bool local_aac;
  bool local_aab;
  bool local_aaa;
  bool local_aa9;
  long *local_aa8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_aa0;
  char **local_a98;
  InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> local_a90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a60;
  int local_a54;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a40;
  float local_a38;
  float local_a34;
  string local_a30;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a10;
  float local_a04;
  float local_a00;
  float local_9fc;
  string local_9f8;
  string local_9d8;
  long *local_9b8 [2];
  long local_9a8 [2];
  string local_998;
  string local_978;
  string local_958;
  string local_938;
  string local_918;
  undefined1 local_8f8 [8];
  undefined1 auStack_8f0 [8];
  undefined1 auStack_8e8 [16];
  undefined1 auStack_8d8 [32];
  long local_8b8 [2];
  long alStack_8a8 [8];
  aligned_storage_t<sizeof(pbrt::Bounds2<int>),_alignof(pbrt::Bounds2<int>)> aStack_868;
  ulong uStack_858;
  undefined8 uStack_850;
  optional<int> oStack_848;
  undefined1 auStack_840 [8];
  aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
  local_838;
  ulong uStack_830;
  undefined1 auStack_828 [8];
  polymorphic_allocator<pbrt::Half> pStack_820;
  _Base_ptr p_Stack_818;
  _Base_ptr p_Stack_810;
  _Base_ptr p_Stack_808;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> vStack_800;
  string local_7d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7b8;
  undefined1 local_798 [8];
  pointer pIStack_790;
  pointer local_788;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_778;
  string local_770;
  string local_750;
  InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> local_730;
  string local_700;
  string local_6e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6a0;
  aligned_storage_t<sizeof(float),_alignof(float)> local_680;
  uint uStack_67c;
  aligned_storage_t<sizeof(float),_alignof(float)> local_678;
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_670;
  optional<int> local_5d0;
  undefined1 auStack_5c8 [16];
  size_t sStack_5b8;
  size_t local_5b0;
  undefined1 local_5a8 [16];
  size_t sStack_598;
  size_t local_590;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> local_588;
  string local_568;
  _Any_data local_548;
  code *local_538;
  code *local_530;
  _Any_data local_528;
  code *local_518;
  code *local_510;
  _Any_data local_508;
  code *local_4f8;
  code *local_4f0;
  _Any_data local_4e8;
  code *local_4d8;
  code *local_4d0;
  _Any_data local_4c8;
  code *local_4b8;
  code *local_4b0;
  _Any_data local_4a8;
  code *local_498;
  code *local_490;
  _Any_data local_488;
  code *local_478;
  code *local_470;
  _Any_data local_468;
  code *local_458;
  code *local_450;
  _Any_data local_448;
  code *local_438;
  code *local_430;
  undefined8 local_428;
  undefined8 uStack_420;
  code *local_418;
  code *local_410;
  _Any_data local_408;
  code *local_3f8;
  code *local_3f0;
  _Any_data local_3e8;
  code *local_3d8;
  code *local_3d0;
  _Any_data local_3c8;
  code *local_3b8;
  code *local_3b0;
  _Any_data local_3a8;
  code *local_398;
  code *local_390;
  aligned_storage_t<sizeof(float),_alignof(float)> local_380;
  char local_37c;
  aligned_storage_t<sizeof(pbrt::SquareMatrix<4>),_alignof(pbrt::SquareMatrix<4>)> local_378;
  char local_338;
  aligned_storage_t<sizeof(pbrt::SquareMatrix<4>),_alignof(pbrt::SquareMatrix<4>)> local_334;
  char local_2f4;
  aligned_storage_t<sizeof(pbrt::Bounds2<int>),_alignof(pbrt::Bounds2<int>)> local_2f0;
  char local_2e0;
  aligned_storage_t<sizeof(pbrt::Point2<int>),_alignof(pbrt::Point2<int>)> local_2dc;
  char local_2d4;
  aligned_storage_t<sizeof(int),_alignof(int)> local_2d0;
  char local_2cc;
  aligned_storage_t<sizeof(float),_alignof(float)> local_2c8;
  char local_2c4;
  aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
  local_2c0;
  char local_2b8;
  undefined1 local_2b0 [32];
  _Base_ptr p_Stack_290;
  size_t local_288;
  string local_280;
  undefined1 local_260 [16];
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_250;
  optional<int> local_1b0;
  polymorphic_allocator<unsigned_char> pStack_1a8;
  undefined1 local_1a0 [16];
  size_t sStack_190;
  polymorphic_allocator<pbrt::Half> local_188;
  undefined1 local_180 [16];
  size_t sStack_170;
  polymorphic_allocator<float> local_168;
  float *local_160;
  size_t sStack_158;
  size_t sStack_150;
  aligned_storage_t<sizeof(float),_alignof(float)> local_148;
  bool local_144;
  aligned_storage_t<sizeof(pbrt::SquareMatrix<4>),_alignof(pbrt::SquareMatrix<4>)> local_140;
  bool local_100;
  aligned_storage_t<sizeof(pbrt::SquareMatrix<4>),_alignof(pbrt::SquareMatrix<4>)> local_fc;
  bool local_bc;
  aligned_storage_t<sizeof(pbrt::Bounds2<int>),_alignof(pbrt::Bounds2<int>)> local_b8;
  bool local_a8;
  aligned_storage_t<sizeof(pbrt::Point2<int>),_alignof(pbrt::Point2<int>)> local_a4;
  bool local_9c;
  aligned_storage_t<sizeof(int),_alignof(int)> local_98;
  bool local_94;
  aligned_storage_t<sizeof(float),_alignof(float)> local_90;
  bool local_8c;
  aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
  local_88;
  bool local_80;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  local_78;
  optional<int> local_48;
  ColorEncodingHandle local_40;
  ColorEncodingHandle local_38;
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  
  local_aa9 = false;
  local_a38 = 1.0;
  local_9fc = 1.0;
  local_a54 = 1;
  local_aaa = false;
  local_aab = false;
  local_a00 = 1.0;
  local_a04 = INFINITY;
  local_aac = false;
  local_aad = false;
  local_750._M_dataplus._M_p = (pointer)&local_750.field_2;
  local_750._M_string_length = 0;
  local_750.field_2._M_local_buf[0] = '\0';
  local_6a0._M_dataplus._M_p = (pointer)&local_6a0.field_2;
  local_6a0._M_string_length = 0;
  local_6a0.field_2._M_local_buf[0] = '\0';
  local_6c0._M_dataplus._M_p = (pointer)&local_6c0.field_2;
  local_6c0._M_string_length = 0;
  local_6c0.field_2._M_local_buf[0] = '\0';
  local_7b8._M_dataplus._M_p = (pointer)&local_7b8.field_2;
  local_7b8._M_string_length = 0;
  local_7b8.field_2._M_local_buf[0] = '\0';
  local_978._M_dataplus._M_p._0_4_ = -1;
  local_978._M_dataplus._M_p._4_4_ = 0;
  local_978._M_string_length._0_4_ = -1;
  local_978._M_string_length._4_4_ = 0;
  local_a98 = argv;
  if (*argv != (char *)0x0) {
    local_aa8 = local_9a8;
    local_aa0 = &local_998.field_2;
    local_a60 = &local_958.field_2;
    local_a50 = &local_938.field_2;
    local_a48 = &local_918.field_2;
    local_a40 = &local_7d8.field_2;
    local_a10 = &local_770.field_2;
    local_978.field_2._8_8_ = &local_700.field_2;
    local_778 = &local_6e0.field_2;
    do {
      local_260._0_8_ = &local_250;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_260,"acesfilmic","");
      local_3a8._M_unused._M_object = (void *)0x0;
      local_3a8._8_8_ = 0;
      local_390 = std::
                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1363:24)>
                  ::_M_invoke;
      local_398 = std::
                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1363:24)>
                  ::_M_manager;
      bVar17 = pbrt::ParseArg<bool*>
                         (&local_a98,(string *)local_260,&local_aa9,
                          (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                           *)&local_3a8);
      if (bVar17) {
LAB_001f6888:
        local_ac0._0_1_ = true;
        bVar12 = false;
        bVar11 = false;
        bVar10 = false;
        bVar9 = false;
        bVar8 = false;
        bVar7 = false;
        bVar6 = false;
        bVar5 = false;
        bVar18 = false;
        bVar13 = false;
        bVar14 = false;
        bVar15 = false;
      }
      else {
        local_a30._M_dataplus._M_p = (pointer)&local_a30.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_a30,"bw","");
        local_3c8._M_unused._M_object = (void *)0x0;
        local_3c8._8_8_ = 0;
        local_3b0 = std::
                    _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1363:24)>
                    ::_M_invoke;
        local_3b8 = std::
                    _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1363:24)>
                    ::_M_manager;
        bVar18 = pbrt::ParseArg<bool*>
                           (&local_a98,&local_a30,&local_aad,
                            (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                             *)&local_3c8);
        if (bVar18) goto LAB_001f6888;
        local_9f8._M_dataplus._M_p = (pointer)&local_9f8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_9f8,"channels","");
        local_3e8._M_unused._M_object = (void *)0x0;
        local_3e8._8_8_ = 0;
        local_3d0 = std::
                    _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1363:24)>
                    ::_M_invoke;
        local_3d8 = std::
                    _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1363:24)>
                    ::_M_manager;
        bVar18 = pbrt::ParseArg<std::__cxx11::string*>
                           (&local_a98,&local_9f8,&local_7b8,
                            (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                             *)&local_3e8);
        if (bVar18) {
          bVar12 = false;
          bVar11 = false;
          bVar10 = false;
          bVar9 = false;
          bVar8 = false;
          bVar7 = false;
          bVar6 = false;
          bVar5 = false;
          bVar13 = false;
          bVar14 = false;
LAB_001f6bcf:
          bVar15 = true;
          bVar18 = false;
          local_ac0._0_1_ = true;
        }
        else {
          local_9d8._M_dataplus._M_p = (pointer)&local_9d8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_9d8,"colorspace","");
          local_408._M_unused._M_object = (void *)0x0;
          local_408._8_8_ = 0;
          local_3f0 = std::
                      _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1363:24)>
                      ::_M_invoke;
          local_3f8 = std::
                      _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1363:24)>
                      ::_M_manager;
          bVar18 = pbrt::ParseArg<std::__cxx11::string*>
                             (&local_a98,&local_9d8,&local_6c0,
                              (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                               *)&local_408);
          if (bVar18) {
            bVar12 = false;
            bVar11 = false;
            bVar10 = false;
            bVar9 = false;
            bVar8 = false;
            bVar7 = false;
            bVar6 = false;
            bVar5 = false;
            bVar13 = false;
LAB_001f6bc9:
            bVar14 = true;
            goto LAB_001f6bcf;
          }
          local_9b8[0] = local_9a8;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_9b8,"crop","");
          local_428 = 0;
          uStack_420 = 0;
          local_410 = std::
                      _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1363:24)>
                      ::_M_invoke;
          local_418 = std::
                      _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1363:24)>
                      ::_M_manager;
          in_R8 = &local_428;
          out.n = (size_t)in_R8;
          out.ptr = (int *)0x4;
          bVar18 = pbrt::ParseArg<pstd::span<int>>
                             ((pbrt *)&local_a98,(char ***)local_9b8,&local_978,out,in_R9);
          if (bVar18) {
            bVar12 = false;
            bVar11 = false;
            bVar10 = false;
            bVar9 = false;
            bVar8 = false;
            bVar7 = false;
            bVar6 = false;
            bVar5 = false;
LAB_001f6bc3:
            bVar13 = true;
            goto LAB_001f6bc9;
          }
          local_998._M_dataplus._M_p = (pointer)&local_998.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_998,"despike","");
          local_448._M_unused._M_object = (void *)0x0;
          local_448._8_8_ = 0;
          local_430 = std::
                      _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1363:24)>
                      ::_M_invoke;
          local_438 = std::
                      _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1363:24)>
                      ::_M_manager;
          bVar18 = pbrt::ParseArg<float*>
                             (&local_a98,&local_998,&local_a04,
                              (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                               *)&local_448);
          if (bVar18) {
            bVar11 = false;
LAB_001f6bad:
            bVar10 = false;
LAB_001f6bb0:
            bVar9 = false;
LAB_001f6bb3:
            bVar8 = false;
LAB_001f6bb5:
            bVar7 = false;
LAB_001f6bb8:
            bVar6 = false;
LAB_001f6bbb:
            bVar5 = false;
LAB_001f6bbd:
            bVar12 = true;
            goto LAB_001f6bc3;
          }
          local_958._M_dataplus._M_p = (pointer)&local_958.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_958,"flipy","");
          local_468._M_unused._M_object = (void *)0x0;
          local_468._8_8_ = 0;
          local_450 = std::
                      _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1363:24)>
                      ::_M_invoke;
          local_458 = std::
                      _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1363:24)>
                      ::_M_manager;
          bVar18 = pbrt::ParseArg<bool*>
                             (&local_a98,&local_958,&local_aaa,
                              (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                               *)&local_468);
          if (bVar18) {
            bVar11 = true;
            goto LAB_001f6bad;
          }
          local_938._M_dataplus._M_p = (pointer)&local_938.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_938,"gamma","");
          local_488._M_unused._M_object = (void *)0x0;
          local_488._8_8_ = 0;
          local_470 = std::
                      _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1363:24)>
                      ::_M_invoke;
          local_478 = std::
                      _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1363:24)>
                      ::_M_manager;
          bVar18 = pbrt::ParseArg<float*>
                             (&local_a98,&local_938,&local_9fc,
                              (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                               *)&local_488);
          if (bVar18) {
            bVar11 = true;
            bVar10 = true;
            goto LAB_001f6bb0;
          }
          local_918._M_dataplus._M_p = (pointer)&local_918.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_918,"maxluminance","");
          local_4a8._M_unused._M_object = (void *)0x0;
          local_4a8._8_8_ = 0;
          local_490 = std::
                      _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1363:24)>
                      ::_M_invoke;
          local_498 = std::
                      _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1363:24)>
                      ::_M_manager;
          bVar18 = pbrt::ParseArg<float*>
                             (&local_a98,&local_918,&local_a00,
                              (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                               *)&local_4a8);
          if (bVar18) {
            bVar11 = true;
            bVar10 = true;
            bVar9 = true;
            goto LAB_001f6bb3;
          }
          local_7d8._M_dataplus._M_p = (pointer)&local_7d8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_7d8,"outfile","");
          local_4c8._M_unused._M_object = (void *)0x0;
          local_4c8._8_8_ = 0;
          local_4b0 = std::
                      _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1363:24)>
                      ::_M_invoke;
          local_4b8 = std::
                      _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1363:24)>
                      ::_M_manager;
          bVar18 = pbrt::ParseArg<std::__cxx11::string*>
                             (&local_a98,&local_7d8,&local_6a0,
                              (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                               *)&local_4c8);
          if (bVar18) {
            bVar11 = true;
            bVar10 = true;
            bVar9 = true;
            bVar8 = true;
            goto LAB_001f6bb5;
          }
          local_770._M_dataplus._M_p = (pointer)&local_770.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_770,"preservecolors","");
          local_4e8._M_unused._M_object = (void *)0x0;
          local_4e8._8_8_ = 0;
          local_4d0 = std::
                      _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1363:24)>
                      ::_M_invoke;
          local_4d8 = std::
                      _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1363:24)>
                      ::_M_manager;
          bVar18 = pbrt::ParseArg<bool*>
                             (&local_a98,&local_770,&local_aac,
                              (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                               *)&local_4e8);
          if (bVar18) {
            bVar11 = true;
            bVar10 = true;
            bVar9 = true;
            bVar8 = true;
            bVar7 = true;
            goto LAB_001f6bb8;
          }
          local_700._M_dataplus._M_p = (pointer)&local_700.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_700,"repeatpix","");
          local_508._M_unused._M_object = (void *)0x0;
          local_508._8_8_ = 0;
          local_4f0 = std::
                      _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1363:24)>
                      ::_M_invoke;
          local_4f8 = std::
                      _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1363:24)>
                      ::_M_manager;
          bVar18 = pbrt::ParseArg<int*>
                             (&local_a98,&local_700,&local_a54,
                              (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                               *)&local_508);
          if (bVar18) {
            bVar11 = true;
            bVar10 = true;
            bVar9 = true;
            bVar8 = true;
            bVar7 = true;
            bVar6 = true;
            goto LAB_001f6bbb;
          }
          local_6e0._M_dataplus._M_p = (pointer)&local_6e0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_6e0,"scale","");
          local_528._M_unused._M_object = (void *)0x0;
          local_528._8_8_ = 0;
          local_510 = std::
                      _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1363:24)>
                      ::_M_invoke;
          local_518 = std::
                      _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1363:24)>
                      ::_M_manager;
          bVar18 = pbrt::ParseArg<float*>
                             (&local_a98,&local_6e0,&local_a38,
                              (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                               *)&local_528);
          if (bVar18) {
            bVar11 = true;
            bVar10 = true;
            bVar9 = true;
            bVar8 = true;
            bVar7 = true;
            bVar6 = true;
            bVar5 = true;
            goto LAB_001f6bbd;
          }
          local_568._M_dataplus._M_p = (pointer)&local_568.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_568,"tonemap","");
          local_548._M_unused._M_object = (void *)0x0;
          local_548._8_8_ = 0;
          local_530 = std::
                      _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1363:24)>
                      ::_M_invoke;
          local_538 = std::
                      _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1363:24)>
                      ::_M_manager;
          local_ac0._0_1_ =
               pbrt::ParseArg<bool*>
                         (&local_a98,&local_568,&local_aab,
                          (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                           *)&local_548);
          bVar12 = true;
          bVar11 = true;
          bVar10 = true;
          bVar9 = true;
          bVar8 = true;
          bVar7 = true;
          bVar6 = true;
          bVar5 = true;
          bVar18 = true;
          bVar13 = true;
          bVar14 = true;
          bVar15 = true;
        }
      }
      if (bVar18) {
        if (local_538 != (code *)0x0) {
          (*local_538)(&local_548,&local_548,__destroy_functor);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_568._M_dataplus._M_p != &local_568.field_2) {
          operator_delete(local_568._M_dataplus._M_p,local_568.field_2._M_allocated_capacity + 1);
        }
      }
      if (bVar5) {
        if (local_518 != (code *)0x0) {
          (*local_518)(&local_528,&local_528,__destroy_functor);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6e0._M_dataplus._M_p != &local_6e0.field_2) {
          operator_delete(local_6e0._M_dataplus._M_p,local_6e0.field_2._M_allocated_capacity + 1);
        }
      }
      if (bVar6) {
        if (local_4f8 != (code *)0x0) {
          (*local_4f8)(&local_508,&local_508,__destroy_functor);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_700._M_dataplus._M_p != &local_700.field_2) {
          operator_delete(local_700._M_dataplus._M_p,local_700.field_2._M_allocated_capacity + 1);
        }
      }
      if (bVar7) {
        if (local_4d8 != (code *)0x0) {
          (*local_4d8)(&local_4e8,&local_4e8,__destroy_functor);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_770._M_dataplus._M_p != &local_770.field_2) {
          operator_delete(local_770._M_dataplus._M_p,local_770.field_2._M_allocated_capacity + 1);
        }
      }
      if (bVar8) {
        if (local_4b8 != (code *)0x0) {
          (*local_4b8)(&local_4c8,&local_4c8,__destroy_functor);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7d8._M_dataplus._M_p != &local_7d8.field_2) {
          operator_delete(local_7d8._M_dataplus._M_p,local_7d8.field_2._M_allocated_capacity + 1);
        }
      }
      if (bVar9) {
        if (local_498 != (code *)0x0) {
          (*local_498)(&local_4a8,&local_4a8,__destroy_functor);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_918._M_dataplus._M_p != &local_918.field_2) {
          operator_delete(local_918._M_dataplus._M_p,local_918.field_2._M_allocated_capacity + 1);
        }
      }
      if (bVar10) {
        if (local_478 != (code *)0x0) {
          (*local_478)(&local_488,&local_488,__destroy_functor);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_938._M_dataplus._M_p != &local_938.field_2) {
          operator_delete(local_938._M_dataplus._M_p,local_938.field_2._M_allocated_capacity + 1);
        }
      }
      if (bVar11) {
        if (local_458 != (code *)0x0) {
          (*local_458)(&local_468,&local_468,__destroy_functor);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_958._M_dataplus._M_p != &local_958.field_2) {
          operator_delete(local_958._M_dataplus._M_p,local_958.field_2._M_allocated_capacity + 1);
        }
      }
      if (bVar12) {
        if (local_438 != (code *)0x0) {
          (*local_438)(&local_448,&local_448,__destroy_functor);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_998._M_dataplus._M_p != &local_998.field_2) {
          operator_delete(local_998._M_dataplus._M_p,local_998.field_2._M_allocated_capacity + 1);
        }
      }
      if (bVar13) {
        if (local_418 != (code *)0x0) {
          (*local_418)(&local_428,&local_428,3);
        }
        if (local_9b8[0] != local_9a8) {
          operator_delete(local_9b8[0],local_9a8[0] + 1);
        }
      }
      if (bVar14) {
        if (local_3f8 != (code *)0x0) {
          (*local_3f8)(&local_408,&local_408,__destroy_functor);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_9d8._M_dataplus._M_p != &local_9d8.field_2) {
          operator_delete(local_9d8._M_dataplus._M_p,local_9d8.field_2._M_allocated_capacity + 1);
        }
      }
      if (bVar15) {
        if (local_3d8 != (code *)0x0) {
          (*local_3d8)(&local_3e8,&local_3e8,__destroy_functor);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_9f8._M_dataplus._M_p != &local_9f8.field_2) {
          operator_delete(local_9f8._M_dataplus._M_p,local_9f8.field_2._M_allocated_capacity + 1);
        }
      }
      if (!bVar17) {
        if (local_3b8 != (code *)0x0) {
          (*local_3b8)(&local_3c8,&local_3c8,__destroy_functor);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a30._M_dataplus._M_p != &local_a30.field_2) {
          operator_delete(local_a30._M_dataplus._M_p,local_a30.field_2._M_allocated_capacity + 1);
        }
      }
      if (local_398 != (code *)0x0) {
        (*local_398)(&local_3a8,&local_3a8,__destroy_functor);
      }
      if ((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_260._0_8_ != &local_250) {
        operator_delete((void *)local_260._0_8_,(long)local_250.alloc.memoryResource + 1);
      }
      if (local_ac0._0_1_ == false) {
        pcVar40 = *local_a98;
        if ((*pcVar40 == '-') || (local_750._M_string_length != 0)) {
          usage("convert","%s: unknown command flag",pcVar40);
        }
        in_R8 = (undefined8 *)strlen(pcVar40);
        std::__cxx11::string::_M_replace((ulong)&local_750,0,(char *)0x0,(ulong)pcVar40);
        local_a98 = local_a98 + 1;
      }
    } while (*local_a98 != (char *)0x0);
  }
  if (local_a00 <= 0.0) {
    pcVar40 = "--maxluminance value must be greater than zero";
LAB_001f9af1:
    usage("convert",pcVar40);
  }
  if (local_a54 < 1) {
    pcVar40 = "--repeatpix value must be greater than zero";
    goto LAB_001f9af1;
  }
  if ((local_a38 == 0.0) && (!NAN(local_a38))) {
    pcVar40 = "--scale value must be non-zero";
    goto LAB_001f9af1;
  }
  if (local_6a0._M_string_length == 0) {
    pcVar40 = "--outfile filename must be specified";
    goto LAB_001f9af1;
  }
  if (local_750._M_string_length == 0) {
    pcVar40 = "input filename not specified";
    goto LAB_001f9af1;
  }
  AVar21.memoryResource = pstd::pmr::new_delete_resource();
  local_38.
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
          )0;
  pbrt::Image::Read((ImageAndMetadata *)local_260,&local_750,AVar21,&local_38);
  local_678 = (aligned_storage_t<sizeof(float),_alignof(float)>)local_260._8_4_;
  local_680 = SUB84(local_260._0_8_,0);
  uStack_67c = SUB84(local_260._0_8_,4);
  pbrt::
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::InlinedVector(&local_670,&local_250);
  ch = (char)in_R8;
  local_5d0 = local_1b0;
  auStack_5c8._0_8_ = pStack_1a8.memoryResource;
  auVar53 = ZEXT816(0) << 0x20;
  local_5b0 = sStack_190;
  stack0xfffffffffffffa40 = local_1a0;
  sStack_190 = 0;
  local_5a8._0_8_ = local_188.memoryResource;
  local_590 = sStack_170;
  stack0xfffffffffffffa60 = local_180;
  sStack_170 = 0;
  local_588.alloc.memoryResource = local_168.memoryResource;
  local_588.nAlloc = sStack_158;
  local_588.ptr = local_160;
  sStack_150 = 0;
  sStack_158 = SUB168(ZEXT816(0),4);
  local_37c = local_144;
  if (local_144 == true) {
    local_380 = local_148;
    local_144 = false;
  }
  local_338 = local_100;
  if (local_100 == true) {
    local_378 = local_140;
    local_100 = false;
  }
  local_2f4 = local_bc;
  if (local_bc == true) {
    local_334 = local_fc;
    local_bc = false;
  }
  local_2e0 = local_a8;
  if (local_a8 == true) {
    local_2f0 = local_b8;
    local_a8 = false;
  }
  local_2d4 = local_9c;
  if (local_9c == true) {
    local_2dc = local_a4;
    local_9c = false;
  }
  local_2cc = local_94;
  if (local_94 == true) {
    local_2d0 = local_98;
    local_94 = false;
  }
  local_2c4 = local_8c;
  if (local_8c == true) {
    local_2c8 = local_90;
    local_8c = false;
  }
  local_2b8 = local_80;
  if (local_80 == true) {
    local_2c0 = local_88;
    local_80 = false;
  }
  p_Var1 = (_Base_ptr)(local_2b0 + 8);
  if (local_78._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
    psVar24 = &local_288;
    local_2b0._8_4_ = _S_red;
    local_2b0._16_8_ = (_Base_ptr)0x0;
    p_Stack_290 = p_Var1;
    local_2b0._24_8_ = p_Var1;
  }
  else {
    p_Var2 = &local_78._M_impl.super__Rb_tree_header;
    local_2b0._8_4_ = local_78._M_impl.super__Rb_tree_header._M_header._M_color;
    local_2b0._16_8_ = local_78._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Stack_290 = local_78._M_impl.super__Rb_tree_header._M_header._M_right;
    local_2b0._24_8_ = local_78._M_impl.super__Rb_tree_header._M_header._M_left;
    (local_78._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = p_Var1;
    psVar24 = &local_78._M_impl.super__Rb_tree_header._M_node_count;
    local_288 = local_78._M_impl.super__Rb_tree_header._M_node_count;
    local_78._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_78._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
    local_78._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  }
  local_1a0 = auVar53;
  local_180 = auVar53;
  local_160 = (float *)0x0;
  *psVar24 = 0;
  if ((pbrt *)local_7b8._M_string_length == (pbrt *)0x0) {
    pbrt::Image::ChannelNames_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_8f8,(Image *)&local_680.__align);
    auVar48 = auStack_8f0;
    ch = (char)in_R8;
    if (local_8f8 == auStack_8f0) {
      bVar17 = false;
    }
    else {
      oVar31 = (optional<float>)local_8f8;
      bVar18 = false;
      do {
        iVar19 = std::__cxx11::string::compare((char *)oVar31);
        if (((iVar19 == 0) || (iVar19 = std::__cxx11::string::compare((char *)oVar31), iVar19 == 0))
           || (iVar19 = std::__cxx11::string::compare((char *)oVar31), iVar19 == 0)) {
LAB_001f783f:
          bVar5 = false;
          bVar17 = bVar18;
        }
        else {
          iVar19 = std::__cxx11::string::compare((char *)oVar31);
          bVar5 = true;
          bVar17 = true;
          if (iVar19 == 0) goto LAB_001f783f;
        }
        ch = (char)in_R8;
      } while ((!bVar5) &&
              (oVar31 = (optional<float>)((long)oVar31 + 0x20), bVar18 = bVar17,
              oVar31 != (optional<float>)auVar48));
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_8f8);
    if (bVar17) {
      local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"exr","");
      bVar17 = pbrt::HasExtension(&local_6a0,&local_280);
      bVar17 = !bVar17;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_280._M_dataplus._M_p != &local_280.field_2) {
        operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      bVar17 = false;
    }
    if (bVar17) {
      fprintf(_stderr,
              "%s: image has non-RGB channels but converting to an image format that can\'t store them. Converting RGB only.\n"
              ,local_750._M_dataplus._M_p);
      ch = '\x05';
      std::__cxx11::string::_M_replace
                ((ulong)&local_7b8,0,(char *)local_7b8._M_string_length,0x460508);
    }
  }
  if ((pbrt *)local_7b8._M_string_length == (pbrt *)0x0) {
LAB_001f7acb:
    iVar19 = (int)local_670.nStored;
    if (local_978._M_dataplus._M_p._4_4_ < 0) {
      local_978._M_dataplus._M_p._4_4_ =
           (int)local_978._M_dataplus._M_p - local_978._M_dataplus._M_p._4_4_;
    }
    if (local_978._M_string_length._4_4_ < 0) {
      local_978._M_string_length._4_4_ =
           (int)local_978._M_string_length - local_978._M_string_length._4_4_;
    }
    local_ae0 = uStack_67c;
    aStack_adc = local_678;
    if ((-1 < (int)local_978._M_dataplus._M_p) && (-1 < (int)local_978._M_string_length)) {
      iVar36 = (int)local_978._M_dataplus._M_p;
      if (local_978._M_dataplus._M_p._4_4_ < (int)local_978._M_dataplus._M_p) {
        iVar36 = local_978._M_dataplus._M_p._4_4_;
      }
      iVar37 = (int)local_978._M_string_length;
      if (local_978._M_string_length._4_4_ < (int)local_978._M_string_length) {
        iVar37 = local_978._M_string_length._4_4_;
      }
      local_a90.alloc.memoryResource = (memory_resource *)CONCAT44(iVar37,iVar36);
      iVar36 = local_978._M_dataplus._M_p._4_4_;
      if (local_978._M_dataplus._M_p._4_4_ < (int)local_978._M_dataplus._M_p) {
        iVar36 = (int)local_978._M_dataplus._M_p;
      }
      iVar37 = local_978._M_string_length._4_4_;
      if (local_978._M_string_length._4_4_ < (int)local_978._M_string_length) {
        iVar37 = (int)local_978._M_string_length;
      }
      local_a90.ptr = (float *)CONCAT44(iVar37,iVar36);
      AVar21.memoryResource = pstd::pmr::new_delete_resource();
      pbrt::Image::Crop((Image *)local_8f8,(Image *)&local_680.__align,(Bounds2i *)&local_a90,AVar21
                       );
      local_678 = (aligned_storage_t<sizeof(float),_alignof(float)>)auStack_8f0._0_4_;
      local_680 = local_8f8._0_4_;
      uStack_67c = local_8f8._4_4_;
      pbrt::
      InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(&local_670,
                  (InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)auStack_8e8);
      local_5d0 = oStack_848;
      pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::operator=
                ((vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *)
                 auStack_5c8,
                 (vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *)
                 auStack_840);
      pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::operator=
                ((vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *)local_5a8,
                 (vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *)&pStack_820);
      pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=
                (&local_588,&vStack_800);
      vStack_800.nStored = 0;
      (*(vStack_800.alloc.memoryResource)->_vptr_memory_resource[3])
                (vStack_800.alloc.memoryResource,vStack_800.ptr,vStack_800.nAlloc << 2,4);
      p_Stack_808 = (_Base_ptr)0x0;
      (*(pStack_820.memoryResource)->_vptr_memory_resource[3])
                (pStack_820.memoryResource,p_Stack_818,(long)p_Stack_810 * 2,2);
      auStack_828 = (undefined1  [8])0x0;
      (*(*(_func_int ***)auStack_840)[3])(auStack_840,local_838,uStack_830,1);
      pbrt::
      InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~InlinedVector((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)auStack_8e8);
      local_ae0 = uStack_67c;
      aStack_adc = local_678;
    }
    uStack_67c = local_ae0;
    local_678 = aStack_adc;
    if (local_680 != (aligned_storage_t<sizeof(float),_alignof(float)>)0x2) {
      local_40.
      super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
      .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
               )0;
      pbrt::Image::ConvertToFormat((Image *)local_8f8,(Image *)&local_680.__align,Float,&local_40);
      local_678 = (aligned_storage_t<sizeof(float),_alignof(float)>)auStack_8f0._0_4_;
      local_680 = local_8f8._0_4_;
      uStack_67c = local_8f8._4_4_;
      pbrt::
      InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(&local_670,
                  (InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)auStack_8e8);
      local_5d0 = oStack_848;
      pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::operator=
                ((vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *)
                 auStack_5c8,
                 (vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *)
                 auStack_840);
      pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::operator=
                ((vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *)local_5a8,
                 (vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *)&pStack_820);
      pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=
                (&local_588,&vStack_800);
      vStack_800.nStored = 0;
      (*(vStack_800.alloc.memoryResource)->_vptr_memory_resource[3])
                (vStack_800.alloc.memoryResource,vStack_800.ptr,vStack_800.nAlloc << 2,4);
      p_Stack_808 = (_Base_ptr)0x0;
      (*(pStack_820.memoryResource)->_vptr_memory_resource[3])
                (pStack_820.memoryResource,p_Stack_818,(long)p_Stack_810 * 2,2);
      auStack_828 = (undefined1  [8])0x0;
      (*(*(_func_int ***)auStack_840)[3])(auStack_840,local_838,uStack_830,1);
      pbrt::
      InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~InlinedVector((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)auStack_8e8);
    }
    uVar22 = (ulong)(uint)aStack_adc;
    if (local_6c0._M_string_length == 0) {
LAB_001f8150:
      if ((local_aad == true) && (0 < (int)aStack_adc)) {
        local_ac0 = (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)0x0;
        do {
          if (0 < (int)local_ae0) {
            uVar42 = 0;
            do {
              if (iVar19 < 1) {
                fVar51 = 0.0;
              }
              else {
                fVar51 = 0.0;
                iVar36 = 0;
                do {
                  FVar50 = pbrt::Image::GetChannel
                                     ((Image *)&local_680.__align,
                                      (Point2i)((long)local_ac0 << 0x20 | uVar42),iVar36,
                                      (WrapMode2D)0x200000002);
                  fVar51 = fVar51 + FVar50;
                  iVar36 = iVar36 + 1;
                } while (iVar19 != iVar36);
              }
              if (0 < iVar19) {
                iVar36 = 0;
                do {
                  pbrt::Image::SetChannel
                            ((Image *)&local_680.__align,(Point2i)((long)local_ac0 << 0x20 | uVar42)
                             ,iVar36,fVar51 / (float)iVar19);
                  iVar36 = iVar36 + 1;
                } while (iVar19 != iVar36);
              }
              uVar42 = uVar42 + 1;
            } while (uVar42 != (local_ae0 & 0x7fffffff));
          }
          local_ac0 = (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)
                      ((long)local_ac0 + 1);
        } while (local_ac0 !=
                 (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)uVar22);
      }
      if (local_a04 != INFINITY) {
        pbrt::Image::Image((Image *)local_8f8,(Image *)&local_680.__align);
        _local_798 = ZEXT816(0) << 0x40;
        local_788 = (pointer)0x0;
        iVar36 = 9;
        do {
          sVar43 = (size_t)(int)local_670.nStored;
          local_a34 = 0.0;
          local_730.alloc.memoryResource = pstd::pmr::new_delete_resource();
          pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::InlinedVector
                    (&local_a90,sVar43,&local_a34,&local_730.alloc);
          std::vector<pbrt::ImageChannelValues,_std::allocator<pbrt::ImageChannelValues>_>::
          emplace_back<pbrt::ImageChannelValues>
                    ((vector<pbrt::ImageChannelValues,_std::allocator<pbrt::ImageChannelValues>_> *)
                     local_798,(ImageChannelValues *)&local_a90);
          local_a90.nStored = 0;
          (**(code **)(((_Alloc_hider *)&(local_a90.alloc.memoryResource)->_vptr_memory_resource)->
                       _M_p + 0x18))
                    (local_a90.alloc.memoryResource,local_a90.ptr,local_a90.nAlloc << 2,4);
          iVar36 = iVar36 + -1;
        } while (iVar36 != 0);
        uVar42 = 0;
        if (0 < (int)aStack_adc) {
          paVar47 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(ulong)(local_ae0 & 0x7fffffff);
          local_af0 = 0;
          uVar42 = 0;
          local_aa0 = paVar47;
          do {
            if (0 < (int)local_ae0) {
              puVar44 = (undefined1 *)0x0;
              do {
                PVar46.super_Tuple2<pbrt::Point2,_int> =
                     (Tuple2<pbrt::Point2,_int>)(local_af0 << 0x20 | (ulong)puVar44);
                pbrt::Image::GetChannels
                          ((ImageChannelValues *)&local_a90,(Image *)&local_680.__align,PVar46,
                           (WrapMode2D)0x200000002);
                fVar51 = local_a04;
                sVar43 = local_a90.nStored;
                if (local_a90.nStored == 0) {
                  fVar52 = 0.0;
                }
                else {
                  paVar23 = (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                             *)local_a90.ptr;
                  if ((anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                       *)local_a90.ptr ==
                      (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                       *)0x0) {
                    paVar23 = &local_a90.field_2;
                  }
                  fVar52 = 0.0;
                  sVar27 = 0;
                  do {
                    fVar52 = fVar52 + paVar23->fixed[sVar27];
                    sVar27 = sVar27 + 1;
                  } while (local_a90.nStored != sVar27);
                }
                local_a90.nStored = 0;
                (**(code **)(((_Alloc_hider *)
                             &(local_a90.alloc.memoryResource)->_vptr_memory_resource)->_M_p + 0x18)
                )(local_a90.alloc.memoryResource,local_a90.ptr,local_a90.nAlloc << 2,4);
                auVar53 = vcvtusi2ss_avx512f(in_XMM3,sVar43);
                if (fVar51 <= fVar52 / auVar53._0_4_) {
                  local_aa8 = (long *)CONCAT44(local_aa8._4_4_,(int)uVar42 + 1);
                  iVar36 = 0;
                  iVar37 = -1;
                  do {
                    iVar45 = iVar37 + (int)local_af0;
                    if ((-1 < iVar45) && (iVar45 < (int)aStack_adc)) {
                      iVar41 = -1;
                      do {
                        iVar20 = (int)puVar44 + iVar41;
                        if ((-1 < iVar20) && (iVar20 <= (int)local_ae0)) {
                          p.super_Tuple2<pbrt::Point2,_int>.y = iVar45;
                          p.super_Tuple2<pbrt::Point2,_int>.x = iVar20;
                          pbrt::Image::GetChannels
                                    ((ImageChannelValues *)&local_a90,(Image *)&local_680.__align,p,
                                     (WrapMode2D)0x200000002);
                          pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
                          operator=((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                     *)((long)local_798 + (long)iVar36 * 0x30),&local_a90);
                          local_a90.nStored = 0;
                          (**(code **)(((_Alloc_hider *)
                                       &(local_a90.alloc.memoryResource)->_vptr_memory_resource)->
                                       _M_p + 0x18))
                                    (local_a90.alloc.memoryResource,local_a90.ptr,
                                     local_a90.nAlloc << 2,4);
                          iVar36 = iVar36 + 1;
                        }
                        iVar41 = iVar41 + 1;
                      } while (iVar41 != 2);
                    }
                    iVar37 = iVar37 + 1;
                  } while (iVar37 != 2);
                  if (iVar36 != 0) {
                    lVar32 = (long)iVar36;
                    local_af8 = (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *
                                )((long)local_798 + lVar32 * 0x30);
                    auVar48 = local_798;
                    if (iVar36 < 4) {
LAB_001f9431:
                      if ((auVar48 != (undefined1  [8])local_af8) &&
                         (pIVar25 = (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                     *)((long)auVar48 + 0x30), pIVar25 != local_af8)) {
                        pIVar28 = (ImageChannelValues *)0x0;
                        local_ac0 = (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                     *)auVar48;
                        do {
                          pIVar28 = pIVar28 + 1;
                          bVar17 = __gnu_cxx::__ops::_Iter_comp_iter<convert(int,char**)::$_1>::
                                   operator()(pIVar25,(ImageChannelValues *)auVar48,pIVar28);
                          if (bVar17) {
                            pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                            ::InlinedVector(&local_a90,pIVar25);
                            if ((undefined1  [8])pIVar25 != auVar48 &&
                                -1 < (long)pIVar25 - (long)auVar48) {
                              lVar32 = (ulong)pIVar28 / 0x30 + 1;
                              pIVar35 = local_ac0;
                              do {
                                pbrt::
                                InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
                                operator=(pIVar35 + 1,pIVar35);
                                lVar32 = lVar32 + -1;
                                pIVar35 = pIVar35 + -1;
                              } while (1 < lVar32);
                            }
                            pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                            ::operator=((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                         *)auVar48,&local_a90);
                            local_a90.nStored = 0;
                            (**(code **)(((_Alloc_hider *)
                                         &(local_a90.alloc.memoryResource)->_vptr_memory_resource)->
                                         _M_p + 0x18))
                                      (local_a90.alloc.memoryResource,local_a90.ptr,
                                       local_a90.nAlloc << 2,4);
                          }
                          else {
                            pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                            ::InlinedVector(&local_a90,pIVar25);
                            pIVar35 = pIVar25;
                            while( true ) {
                              fVar52 = 0.0;
                              fVar51 = 0.0;
                              auVar57 = ZEXT1664(ZEXT816(0) << 0x40);
                              if (local_a90.nStored != 0) {
                                paVar23 = (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                                           *)local_a90.ptr;
                                if ((anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                                     *)local_a90.ptr ==
                                    (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                                     *)0x0) {
                                  paVar23 = &local_a90.field_2;
                                }
                                sVar43 = 0;
                                do {
                                  fVar51 = auVar57._0_4_ + paVar23->fixed[sVar43];
                                  auVar57 = ZEXT464((uint)fVar51);
                                  sVar43 = sVar43 + 1;
                                } while (local_a90.nStored != sVar43);
                              }
                              sVar43 = pIVar35[-1].nStored;
                              if (sVar43 != 0) {
                                paVar23 = &pIVar35[-1].field_2;
                                if ((anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                                     *)pIVar35[-1].ptr !=
                                    (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                                     *)0x0) {
                                  paVar23 = (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                                             *)pIVar35[-1].ptr;
                                }
                                fVar52 = 0.0;
                                sVar27 = 0;
                                do {
                                  fVar52 = fVar52 + paVar23->fixed[sVar27];
                                  sVar27 = sVar27 + 1;
                                } while (sVar43 != sVar27);
                              }
                              auVar53 = vcvtusi2ss_avx512f(in_XMM3,local_a90.nStored);
                              auVar56 = vcvtusi2ss_avx512f(in_XMM3,sVar43);
                              if (fVar52 / auVar56._0_4_ <= fVar51 / auVar53._0_4_) break;
                              pbrt::
                              InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
                              operator=(pIVar35,pIVar35 + -1);
                              pIVar35 = pIVar35 + -1;
                            }
                            pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                            ::operator=(pIVar35,&local_a90);
                            local_a90.nStored = 0;
                            (**(code **)(((_Alloc_hider *)
                                         &(local_a90.alloc.memoryResource)->_vptr_memory_resource)->
                                         _M_p + 0x18))
                                      (local_a90.alloc.memoryResource,local_a90.ptr,
                                       local_a90.nAlloc << 2,4);
                          }
                          pIVar25 = pIVar25 + 1;
                          local_ac0 = local_ac0 + 1;
                        } while (pIVar25 != local_af8);
                      }
                    }
                    else {
                      pIVar25 = (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *
                                )((long)local_798 + (long)(iVar36 / 2) * 0x30);
                      if (LZCOUNT(lVar32) != 0x3f) {
                        pIVar28 = (ImageChannelValues *)(lVar32 * 0x30);
                        uVar42 = (ulong)(uint)((int)LZCOUNT(lVar32) * 2) ^ 0x7e;
                        do {
                          pIVar33 = (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                     *)((long)auVar48 + ((ulong)pIVar28 / 0x60) * 0x30);
                          pIVar35 = (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                     *)((long)auVar48 + 0x30);
                          pIVar34 = local_af8 + -1;
                          bVar17 = __gnu_cxx::__ops::_Iter_comp_iter<convert(int,char**)::$_1>::
                                   operator()(pIVar35,(ImageChannelValues *)pIVar33,pIVar28);
                          if (bVar17) {
                            bVar17 = __gnu_cxx::__ops::_Iter_comp_iter<convert(int,char**)::$_1>::
                                     operator()(pIVar33,(ImageChannelValues *)pIVar34,__it2);
                            if (bVar17) {
                              pbrt::
                              InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
                              InlinedVector(&local_a90,
                                            (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                             *)auVar48);
                              pbrt::
                              InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
                              operator=((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                         *)auVar48,pIVar33);
                              pbrt::
                              InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
                              operator=(pIVar33,&local_a90);
                              local_a90.nStored = 0;
                              (**(code **)(((_Alloc_hider *)
                                           &(local_a90.alloc.memoryResource)->_vptr_memory_resource)
                                           ->_M_p + 0x18))
                                        (local_a90.alloc.memoryResource,local_a90.ptr,
                                         local_a90.nAlloc << 2,4);
                              pIVar28 = extraout_RDX;
                            }
                            else {
                              bVar17 = __gnu_cxx::__ops::_Iter_comp_iter<convert(int,char**)::$_1>::
                                       operator()(pIVar35,(ImageChannelValues *)pIVar34,__it2_00);
                              if (bVar17) {
                                pbrt::
                                InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
                                InlinedVector(&local_a90,
                                              (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                               *)auVar48);
                                pbrt::
                                InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
                                operator=((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                           *)auVar48,pIVar34);
                                pbrt::
                                InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
                                operator=(pIVar34,&local_a90);
                                local_a90.nStored = 0;
                                (**(code **)(((_Alloc_hider *)
                                             &(local_a90.alloc.memoryResource)->
                                              _vptr_memory_resource)->_M_p + 0x18))
                                          (local_a90.alloc.memoryResource,local_a90.ptr,
                                           local_a90.nAlloc << 2,4);
                                pIVar28 = extraout_RDX_01;
                              }
                              else {
                                pbrt::
                                InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
                                InlinedVector(&local_a90,
                                              (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                               *)auVar48);
                                pbrt::
                                InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
                                operator=((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                           *)auVar48,pIVar35);
                                pbrt::
                                InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
                                operator=(pIVar35,&local_a90);
                                local_a90.nStored = 0;
                                (**(code **)(((_Alloc_hider *)
                                             &(local_a90.alloc.memoryResource)->
                                              _vptr_memory_resource)->_M_p + 0x18))
                                          (local_a90.alloc.memoryResource,local_a90.ptr,
                                           local_a90.nAlloc << 2,4);
                                pIVar28 = extraout_RDX_03;
                              }
                            }
                          }
                          else {
                            bVar17 = __gnu_cxx::__ops::_Iter_comp_iter<convert(int,char**)::$_1>::
                                     operator()(pIVar35,(ImageChannelValues *)pIVar34,__it2);
                            if (bVar17) {
                              pbrt::
                              InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
                              InlinedVector(&local_a90,
                                            (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                             *)auVar48);
                              pbrt::
                              InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
                              operator=((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                         *)auVar48,pIVar35);
                              pbrt::
                              InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
                              operator=(pIVar35,&local_a90);
                              local_a90.nStored = 0;
                              (**(code **)(((_Alloc_hider *)
                                           &(local_a90.alloc.memoryResource)->_vptr_memory_resource)
                                           ->_M_p + 0x18))
                                        (local_a90.alloc.memoryResource,local_a90.ptr,
                                         local_a90.nAlloc << 2,4);
                              pIVar28 = extraout_RDX_00;
                            }
                            else {
                              bVar17 = __gnu_cxx::__ops::_Iter_comp_iter<convert(int,char**)::$_1>::
                                       operator()(pIVar33,(ImageChannelValues *)pIVar34,__it2_01);
                              if (bVar17) {
                                pbrt::
                                InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
                                InlinedVector(&local_a90,
                                              (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                               *)auVar48);
                                pbrt::
                                InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
                                operator=((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                           *)auVar48,pIVar34);
                                pbrt::
                                InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
                                operator=(pIVar34,&local_a90);
                                local_a90.nStored = 0;
                                (**(code **)(((_Alloc_hider *)
                                             &(local_a90.alloc.memoryResource)->
                                              _vptr_memory_resource)->_M_p + 0x18))
                                          (local_a90.alloc.memoryResource,local_a90.ptr,
                                           local_a90.nAlloc << 2,4);
                                pIVar28 = extraout_RDX_02;
                              }
                              else {
                                pbrt::
                                InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
                                InlinedVector(&local_a90,
                                              (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                               *)auVar48);
                                pbrt::
                                InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
                                operator=((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                           *)auVar48,pIVar33);
                                pbrt::
                                InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
                                operator=(pIVar33,&local_a90);
                                local_a90.nStored = 0;
                                (**(code **)(((_Alloc_hider *)
                                             &(local_a90.alloc.memoryResource)->
                                              _vptr_memory_resource)->_M_p + 0x18))
                                          (local_a90.alloc.memoryResource,local_a90.ptr,
                                           local_a90.nAlloc << 2,4);
                                pIVar28 = extraout_RDX_04;
                              }
                            }
                          }
                          uVar42 = uVar42 - 1;
                          pIVar34 = local_af8;
                          while( true ) {
                            do {
                              pIVar33 = pIVar35;
                              bVar17 = __gnu_cxx::__ops::_Iter_comp_iter<convert(int,char**)::$_1>::
                                       operator()(pIVar33,(ImageChannelValues *)auVar48,pIVar28);
                              pIVar28 = extraout_RDX_05;
                              pIVar35 = pIVar33 + 1;
                            } while (bVar17);
                            do {
                              pIVar34 = pIVar34 + -1;
                              bVar17 = __gnu_cxx::__ops::_Iter_comp_iter<convert(int,char**)::$_1>::
                                       operator()((void *)auVar48,(ImageChannelValues *)pIVar34,
                                                  pIVar28);
                              pIVar28 = extraout_RDX_06;
                            } while (bVar17);
                            if (pIVar34 <= pIVar33) break;
                            pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                            ::InlinedVector(&local_a90,pIVar33);
                            pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                            ::operator=(pIVar33,pIVar34);
                            pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                            ::operator=(pIVar34,&local_a90);
                            local_a90.nStored = 0;
                            (**(code **)(((_Alloc_hider *)
                                         &(local_a90.alloc.memoryResource)->_vptr_memory_resource)->
                                         _M_p + 0x18))
                                      (local_a90.alloc.memoryResource,local_a90.ptr,
                                       local_a90.nAlloc << 2,4);
                            pIVar28 = extraout_RDX_07;
                          }
                          if (pIVar33 <= pIVar25) {
                            auVar48 = (undefined1  [8])pIVar33;
                            pIVar33 = local_af8;
                          }
                          pIVar28 = (ImageChannelValues *)((long)pIVar33 - (long)auVar48);
                          local_af8 = pIVar33;
                          if ((long)pIVar28 < 0x91) goto LAB_001f9431;
                        } while (uVar42 != 0);
                      }
                      pIVar35 = pIVar25 + 1;
                      pIVar29 = (ImageChannelValues *)
                                (((long)pIVar35 - (long)auVar48 >> 4) * -0x5555555555555555);
                      pIVar28 = pIVar29;
                      if (0x5f < (long)pIVar35 - (long)auVar48) {
                        uVar42 = (ulong)((long)&pIVar29[-1].
                                                super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                                .nStored + 6U) >> 1;
                        do {
                          pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
                          InlinedVector(&local_a90,
                                        (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                         *)((long)auVar48 + uVar42 * 0x30));
                          pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
                          InlinedVector(&local_730,&local_a90);
                          std::
                          __adjust_heap<pbrt::ImageChannelValues*,long,pbrt::ImageChannelValues,__gnu_cxx::__ops::_Iter_comp_iter<convert(int,char**)::__1>>
                                    (auVar48,uVar42,pIVar29,&local_730);
                          local_730.nStored = 0;
                          (**(_func_int **)
                             ((long)((_Alloc_hider *)
                                    &(local_730.alloc.memoryResource)->_vptr_memory_resource)->_M_p
                             + 0x18))(local_730.alloc.memoryResource,local_730.ptr,
                                      local_730.nAlloc << 2,4);
                          local_a90.nStored = 0;
                          (**(code **)(((_Alloc_hider *)
                                       &(local_a90.alloc.memoryResource)->_vptr_memory_resource)->
                                       _M_p + 0x18))
                                    (local_a90.alloc.memoryResource,local_a90.ptr,
                                     local_a90.nAlloc << 2,4);
                          bVar17 = uVar42 != 0;
                          uVar42 = uVar42 - 1;
                          pIVar28 = extraout_RDX_08;
                        } while (bVar17);
                      }
                      for (; pIVar35 < local_af8; pIVar35 = pIVar35 + 1) {
                        bVar17 = __gnu_cxx::__ops::_Iter_comp_iter<convert(int,char**)::$_1>::
                                 operator()(pIVar35,(ImageChannelValues *)auVar48,pIVar28);
                        pIVar28 = extraout_RDX_09;
                        if (bVar17) {
                          pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
                          InlinedVector(&local_a90,pIVar35);
                          pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
                          operator=(pIVar35,(InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                             *)auVar48);
                          pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
                          InlinedVector(&local_730,&local_a90);
                          std::
                          __adjust_heap<pbrt::ImageChannelValues*,long,pbrt::ImageChannelValues,__gnu_cxx::__ops::_Iter_comp_iter<convert(int,char**)::__1>>
                                    (auVar48,0,pIVar29,&local_730);
                          local_730.nStored = 0;
                          (**(_func_int **)
                             ((long)((_Alloc_hider *)
                                    &(local_730.alloc.memoryResource)->_vptr_memory_resource)->_M_p
                             + 0x18))(local_730.alloc.memoryResource,local_730.ptr,
                                      local_730.nAlloc << 2,4);
                          local_a90.nStored = 0;
                          (**(code **)(((_Alloc_hider *)
                                       &(local_a90.alloc.memoryResource)->_vptr_memory_resource)->
                                       _M_p + 0x18))
                                    (local_a90.alloc.memoryResource,local_a90.ptr,
                                     local_a90.nAlloc << 2,4);
                          pIVar28 = extraout_RDX_10;
                        }
                      }
                      pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
                      InlinedVector(&local_a90,
                                    (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                     *)auVar48);
                      pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
                      operator=((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *
                                )auVar48,pIVar25);
                      pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
                      operator=(pIVar25,&local_a90);
                      local_a90.nStored = 0;
                      (**(code **)(((_Alloc_hider *)
                                   &(local_a90.alloc.memoryResource)->_vptr_memory_resource)->_M_p +
                                  0x18))(local_a90.alloc.memoryResource,local_a90.ptr,
                                         local_a90.nAlloc << 2,4);
                    }
                  }
                  pbrt::Image::SetChannels
                            ((Image *)local_8f8,PVar46,
                             (ImageChannelValues *)((long)local_798 + (long)(iVar36 / 2) * 0x30));
                  uVar42 = (ulong)local_aa8 & 0xffffffff;
                  paVar47 = local_aa0;
                }
                puVar44 = puVar44 + 1;
              } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)puVar44 != paVar47);
            }
            local_af0 = local_af0 + 1;
          } while (local_af0 != uVar22);
        }
        pstd::swap<pbrt::Image>((Image *)&local_680.__align,(Image *)local_8f8);
        fprintf(_stderr,"%s: despiked %d pixels\n",local_750._M_dataplus._M_p,uVar42);
        std::vector<pbrt::ImageChannelValues,_std::allocator<pbrt::ImageChannelValues>_>::~vector
                  ((vector<pbrt::ImageChannelValues,_std::allocator<pbrt::ImageChannelValues>_> *)
                   local_798);
        vStack_800.nStored = 0;
        (*(vStack_800.alloc.memoryResource)->_vptr_memory_resource[3])
                  (vStack_800.alloc.memoryResource,vStack_800.ptr,vStack_800.nAlloc << 2,4);
        p_Stack_808 = (_Base_ptr)0x0;
        (*(pStack_820.memoryResource)->_vptr_memory_resource[3])
                  (pStack_820.memoryResource,p_Stack_818,(long)p_Stack_810 * 2,2);
        auStack_828 = (undefined1  [8])0x0;
        (*(*(_func_int ***)auStack_840)[3])(auStack_840,local_838,uStack_830,1);
        pbrt::
        InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~InlinedVector((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)auStack_8e8);
      }
      if (((local_a38 != 1.0) || (NAN(local_a38))) && (0 < (int)aStack_adc)) {
        local_b00 = 0;
        do {
          if (0 < (int)local_ae0) {
            uVar42 = 0;
            do {
              if (0 < iVar19) {
                PVar46.super_Tuple2<pbrt::Point2,_int> =
                     (Tuple2<pbrt::Point2,_int>)(local_b00 << 0x20 | uVar42);
                iVar36 = 0;
                do {
                  fVar51 = local_a38;
                  FVar50 = pbrt::Image::GetChannel
                                     ((Image *)&local_680.__align,PVar46,iVar36,
                                      (WrapMode2D)0x200000002);
                  pbrt::Image::SetChannel((Image *)&local_680.__align,PVar46,iVar36,FVar50 * fVar51)
                  ;
                  iVar36 = iVar36 + 1;
                } while (iVar19 != iVar36);
              }
              uVar42 = uVar42 + 1;
            } while (uVar42 != (local_ae0 & 0x7fffffff));
          }
          local_b00 = local_b00 + 1;
        } while (local_b00 != uVar22);
      }
      if (((local_9fc != 1.0) || (NAN(local_9fc))) && (0 < (int)aStack_adc)) {
        local_af8 = (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)0x0;
        do {
          if (0 < (int)local_ae0) {
            uVar42 = 0;
            do {
              if (0 < iVar19) {
                PVar46.super_Tuple2<pbrt::Point2,_int> =
                     (Tuple2<pbrt::Point2,_int>)((long)local_af8 << 0x20 | uVar42);
                iVar36 = 0;
                do {
                  auVar57._0_4_ =
                       pbrt::Image::GetChannel
                                 ((Image *)&local_680.__align,PVar46,iVar36,(WrapMode2D)0x200000002)
                  ;
                  auVar57._4_60_ = extraout_var;
                  auVar53 = vmaxss_avx(auVar57._0_16_,ZEXT416(0));
                  fVar51 = powf(auVar53._0_4_,local_9fc);
                  pbrt::Image::SetChannel((Image *)&local_680.__align,PVar46,iVar36,fVar51);
                  iVar36 = iVar36 + 1;
                } while (iVar19 != iVar36);
              }
              uVar42 = uVar42 + 1;
            } while (uVar42 != (local_ae0 & 0x7fffffff));
          }
          local_af8 = (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)
                      ((long)local_af8 + 1);
        } while (local_af8 !=
                 (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)uVar22);
      }
      if ((local_aab == true) && (0 < (int)aStack_adc)) {
        local_b00 = 0;
        do {
          if (0 < (int)local_ae0) {
            uVar42 = 0;
            do {
              PVar46.super_Tuple2<pbrt::Point2,_int> =
                   (Tuple2<pbrt::Point2,_int>)(local_b00 << 0x20 | uVar42);
              pbrt::Image::GetChannels
                        ((ImageChannelValues *)local_8f8,(Image *)&local_680.__align,PVar46,
                         (WrapMode2D)0x200000002);
              uVar3 = auStack_8d8._8_8_;
              if (auStack_8d8._8_8_ == 0) {
                fVar51 = 0.0;
              }
              else {
                oVar31 = (optional<float>)auStack_8f0;
                if ((optional<float>)auStack_8f0 == (optional<float>)0x0) {
                  oVar31 = (optional<float>)auStack_8e8;
                }
                fVar51 = 0.0;
                sVar26 = 0;
                do {
                  fVar51 = fVar51 + *(float *)((long)oVar31 + sVar26 * 4);
                  sVar26 = sVar26 + 1;
                } while (auStack_8d8._8_8_ != sVar26);
              }
              auStack_8d8._8_8_ = 0;
              (**(code **)(*(long *)local_8f8 + 0x18))
                        (local_8f8,auStack_8f0,auStack_8d8._0_8_ << 2,4);
              if (0 < iVar19) {
                auVar53 = vcvtusi2ss_avx512f(in_XMM3,uVar3);
                fVar51 = fVar51 / auVar53._0_4_;
                fVar52 = local_a00 * local_a00;
                iVar36 = 0;
                do {
                  FVar50 = pbrt::Image::GetChannel
                                     ((Image *)&local_680.__align,PVar46,iVar36,
                                      (WrapMode2D)0x200000002);
                  pbrt::Image::SetChannel
                            ((Image *)&local_680.__align,PVar46,iVar36,
                             FVar50 * ((fVar51 / fVar52 + 1.0) / (fVar51 + 1.0)));
                  iVar36 = iVar36 + 1;
                } while (iVar19 != iVar36);
              }
              uVar42 = uVar42 + 1;
            } while (uVar42 != (local_ae0 & 0x7fffffff));
          }
          local_b00 = local_b00 + 1;
        } while (local_b00 != uVar22);
      }
      if ((local_aac == true) && (0 < (int)aStack_adc)) {
        local_b00 = 0;
        do {
          if (0 < (int)local_ae0) {
            uVar42 = 0;
            do {
              PVar46.super_Tuple2<pbrt::Point2,_int> =
                   (Tuple2<pbrt::Point2,_int>)(local_b00 << 0x20 | uVar42);
              fVar51 = pbrt::Image::GetChannel
                                 ((Image *)&local_680.__align,PVar46,0,(WrapMode2D)0x200000002);
              if (1 < iVar19) {
                iVar36 = 1;
                do {
                  auVar54._0_4_ =
                       pbrt::Image::GetChannel
                                 ((Image *)&local_680.__align,PVar46,iVar36,(WrapMode2D)0x200000002)
                  ;
                  auVar54._4_60_ = extraout_var_00;
                  auVar53 = vmaxss_avx(auVar54._0_16_,ZEXT416((uint)fVar51));
                  fVar51 = auVar53._0_4_;
                  iVar36 = iVar36 + 1;
                } while (iVar19 != iVar36);
              }
              if (1.0 < fVar51 && 0 < iVar19) {
                iVar36 = 0;
                do {
                  FVar50 = pbrt::Image::GetChannel
                                     ((Image *)&local_680.__align,PVar46,iVar36,
                                      (WrapMode2D)0x200000002);
                  pbrt::Image::SetChannel((Image *)&local_680.__align,PVar46,iVar36,FVar50 / fVar51)
                  ;
                  iVar36 = iVar36 + 1;
                } while (iVar19 != iVar36);
              }
              uVar42 = uVar42 + 1;
            } while (uVar42 != (local_ae0 & 0x7fffffff));
          }
          local_b00 = local_b00 + 1;
        } while (local_b00 != uVar22);
      }
      if ((local_aa9 == true) && (0 < (int)aStack_adc)) {
        local_af8 = (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)0x0;
        do {
          if (0 < (int)local_ae0) {
            uVar42 = 0;
            do {
              if (0 < iVar19) {
                PVar46.super_Tuple2<pbrt::Point2,_int> =
                     (Tuple2<pbrt::Point2,_int>)((long)local_af8 << 0x20 | uVar42);
                iVar36 = 0;
                do {
                  auVar55._0_4_ =
                       pbrt::Image::GetChannel
                                 ((Image *)&local_680.__align,PVar46,iVar36,(WrapMode2D)0x200000002)
                  ;
                  auVar55._4_60_ = extraout_var_01;
                  auVar53 = auVar55._0_16_;
                  FVar50 = 0.0;
                  if (0.0 < auVar55._0_4_) {
                    auVar56 = vfmadd213ss_fma(SUB6416(ZEXT464(0x4020a3d7),0),auVar53,
                                              ZEXT416(0x3cf5c28f));
                    auVar4 = vfmadd213ss_fma(SUB6416(ZEXT464(0x401b851f),0),auVar53,
                                             ZEXT416(0x3f170a3d));
                    auVar53 = vfmadd213ss_fma(auVar4,auVar53,ZEXT416(0x3e0f5c29));
                    auVar56 = ZEXT416((uint)((auVar55._0_4_ * auVar56._0_4_) / auVar53._0_4_));
                    auVar53 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar56);
                    uVar3 = vcmpss_avx512f(auVar56,ZEXT816(0) << 0x20,1);
                    FVar50 = (Float)((uint)!(bool)((byte)uVar3 & 1) * auVar53._0_4_);
                  }
                  pbrt::Image::SetChannel((Image *)&local_680.__align,PVar46,iVar36,FVar50);
                  iVar36 = iVar36 + 1;
                } while (iVar19 != iVar36);
              }
              uVar42 = uVar42 + 1;
            } while (uVar42 != (local_ae0 & 0x7fffffff));
          }
          local_af8 = (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)
                      ((long)local_af8 + 1);
        } while (local_af8 !=
                 (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)uVar22);
      }
      format = local_680;
      iVar36 = local_a54;
      if (1 < local_a54) {
        pbrt::Image::ChannelNames_abi_cxx11_
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_a90,(Image *)&local_680.__align);
        pVar16.memoryResource = local_a90.alloc.memoryResource;
        PVar46.super_Tuple2<pbrt::Point2,_int>.x = iVar36 * local_ae0;
        lVar32 = (long)local_a90.ptr - (long)local_a90.alloc.memoryResource;
        local_48 = local_5d0;
        AVar21.memoryResource = pstd::pmr::new_delete_resource();
        PVar46.super_Tuple2<pbrt::Point2,_int>.y = iVar36 * (int)aStack_adc;
        channels_00.n = lVar32 >> 5;
        channels_00.ptr =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             pVar16.memoryResource;
        pbrt::Image::Image((Image *)local_8f8,(PixelFormat)format,PVar46,channels_00,
                           (ColorEncodingHandle *)&local_48,AVar21);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_a90);
        if (0 < local_a54 * (int)aStack_adc) {
          local_b00 = 0;
          do {
            if (0 < (int)(local_a54 * local_ae0)) {
              lVar32 = (long)local_a54;
              uVar22 = 0;
              do {
                if (0 < iVar19) {
                  lVar39 = (long)local_a54;
                  iVar36 = 0;
                  do {
                    FVar50 = pbrt::Image::GetChannel
                                       ((Image *)&local_680.__align,
                                        (Point2i)((long)((ulong)(uint)((int)uVar22 >> 0x1f) << 0x20
                                                        | uVar22 & 0xffffffff) / lVar39 &
                                                  0xffffffffU |
                                                 (long)((ulong)(uint)((int)local_b00 >> 0x1f) <<
                                                        0x20 | local_b00 & 0xffffffff) / lVar32 <<
                                                 0x20),iVar36,(WrapMode2D)0x200000002);
                    pbrt::Image::SetChannel
                              ((Image *)local_8f8,(Point2i)(local_b00 << 0x20 | uVar22),iVar36,
                               FVar50);
                    iVar36 = iVar36 + 1;
                  } while (iVar19 != iVar36);
                }
                uVar22 = uVar22 + 1;
              } while ((long)uVar22 < (long)(int)(local_a54 * local_ae0));
            }
            local_b00 = local_b00 + 1;
          } while ((long)local_b00 < (long)(local_a54 * (int)aStack_adc));
        }
        local_678 = (aligned_storage_t<sizeof(float),_alignof(float)>)auStack_8f0._0_4_;
        local_680 = local_8f8._0_4_;
        uStack_67c = local_8f8._4_4_;
        pbrt::
        InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=(&local_670,
                    (InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)auStack_8e8);
        local_5d0 = oStack_848;
        pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::operator=
                  ((vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *)
                   auStack_5c8,
                   (vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *)
                   auStack_840);
        pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::operator=
                  ((vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *)local_5a8,
                   (vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *)&pStack_820)
        ;
        pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=
                  (&local_588,&vStack_800);
        vStack_800.nStored = 0;
        (*(vStack_800.alloc.memoryResource)->_vptr_memory_resource[3])
                  (vStack_800.alloc.memoryResource,vStack_800.ptr,vStack_800.nAlloc << 2,4);
        p_Stack_808 = (_Base_ptr)0x0;
        (*(pStack_820.memoryResource)->_vptr_memory_resource[3])
                  (pStack_820.memoryResource,p_Stack_818,(long)p_Stack_810 * 2,2);
        auStack_828 = (undefined1  [8])0x0;
        (*(*(_func_int ***)auStack_840)[3])(auStack_840,local_838,uStack_830,1);
        pbrt::
        InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~InlinedVector((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)auStack_8e8);
      }
      if (local_aaa == true) {
        pbrt::Image::FlipY((Image *)&local_680.__align);
      }
      p_Stack_810 = (_Base_ptr)&pStack_820;
      local_838 = (aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
                   )0x0;
      uStack_830 = 0;
      auStack_828 = (undefined1  [8])0x0;
      pStack_820.memoryResource = (memory_resource *)0x0;
      p_Stack_818 = (_Base_ptr)0x0;
      alStack_8a8[6] = 0;
      alStack_8a8[7] = 0;
      aStack_868._0_8_ = 0;
      aStack_868._8_8_ = 0;
      uStack_858 = 0;
      uStack_850 = 0;
      oStack_848.optionalValue = (aligned_storage_t<sizeof(int),_alignof(int)>)0x0;
      oStack_848.set = false;
      oStack_848._5_3_ = 0;
      auStack_840._0_4_ = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
      auStack_840[4] = false;
      auStack_840._5_3_ = 0;
      local_8b8[0] = 0;
      local_8b8[1] = 0;
      alStack_8a8[0] = 0;
      alStack_8a8[1] = 0;
      alStack_8a8[2] = 0;
      alStack_8a8[3] = 0;
      alStack_8a8[4] = 0;
      alStack_8a8[5] = 0;
      local_8f8._0_4_ = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
      local_8f8[4] = false;
      local_8f8._5_3_ = 0;
      auStack_8f0._0_4_ = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
      auStack_8f0[4] = false;
      auStack_8f0._5_3_ = 0;
      auStack_8e8._0_8_ = (pointer)0x0;
      auStack_8e8._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      auStack_8d8._0_8_ = (pointer)0x0;
      auStack_8d8._8_8_ = 0;
      auStack_8d8._16_8_ = 0;
      auStack_8d8._24_8_ = 0;
      vStack_800.alloc.memoryResource = (memory_resource *)0x0;
      p_Stack_808 = p_Stack_810;
      bVar17 = pbrt::Image::Write((Image *)&local_680.__align,&local_6a0,(ImageMetadata *)local_8f8)
      ;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                   *)auStack_828);
      if (uStack_830._0_1_ == true) {
        uStack_830 = uStack_830 & 0xffffffffffffff00;
      }
      if ((bool)auStack_840[4] == true) {
        auStack_840[4] = 0;
      }
      if (oStack_848.set == true) {
        oStack_848.set = false;
      }
      if (uStack_850._4_1_ == true) {
        uStack_850._0_5_ = (uint5)(uint)(undefined4)uStack_850;
      }
      if (uStack_858._0_1_ == true) {
        uStack_858 = uStack_858 & 0xffffffffffffff00;
      }
      if (alStack_8a8[7]._4_1_ == '\x01') {
        alStack_8a8[7]._0_5_ = CONCAT14(0,(undefined4)alStack_8a8[7]);
      }
      if ((undefined1)local_8b8[1] == '\x01') {
        local_8b8[1] = local_8b8[1] & 0xffffffffffffff00;
      }
      if ((bool)local_8f8[4] == true) {
        local_8f8[4] = 0;
      }
      uVar30 = (uint)!bVar17;
      goto LAB_001f9733;
    }
    to = (aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
          )pbrt::RGBColorSpace::GetNamed(&local_6c0);
    if (to == (aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
               )0x0) {
      convert();
    }
    else {
      local_8f8 = (undefined1  [8])auStack_8e8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_8f8,"R","");
      auStack_8d8._0_8_ = auStack_8d8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)auStack_8d8,"G","");
      _Var49._M_p = (pointer)alStack_8a8;
      local_8b8[0] = (long)_Var49._M_p;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_8b8,"B","");
      requestedChannels_00.n = 3;
      requestedChannels_00.ptr =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_8f8;
      pbrt::Image::GetChannelDesc
                ((ImageChannelDesc *)&local_a90,(Image *)&local_680.__align,requestedChannels_00);
      lVar32 = -0x60;
      do {
        if ((long *)_Var49._M_p != *(long **)((long)_Var49._M_p + -0x10)) {
          operator_delete(*(long **)((long)_Var49._M_p + -0x10),*(long *)_Var49._M_p + 1);
        }
        sVar43 = local_a90.nStored;
        _Var49._M_p = _Var49._M_p + -0x20;
        lVar32 = lVar32 + 0x20;
      } while (lVar32 != 0);
      if (local_a90.nStored == 0) {
        convert();
      }
      else {
        from = local_2c0;
        if (local_2c0 ==
            (aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
             )0x0) {
          from = pbrt::RGBColorSpace::sRGB;
        }
        if (local_2b8 == '\0') {
          from = pbrt::RGBColorSpace::sRGB;
        }
        pbrt::ConvertRGBColorSpace
                  ((SquareMatrix<3> *)&local_730,(RGBColorSpace *)from,(RGBColorSpace *)to);
        if (0 < (int)aStack_adc) {
          local_af8 = (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)0x0;
          do {
            if (0 < (int)local_ae0) {
              uVar42 = 0;
              do {
                PVar46.super_Tuple2<pbrt::Point2,_int> =
                     (Tuple2<pbrt::Point2,_int>)((long)local_af8 << 0x20 | uVar42);
                pbrt::Image::GetChannels
                          ((ImageChannelValues *)local_8f8,(Image *)&local_680.__align,PVar46,
                           (ImageChannelDesc *)&local_a90,(WrapMode2D)0x200000002);
                auVar53._8_8_ = 0;
                auVar53._0_8_ = pIStack_790;
                _local_798 = auVar53 << 0x40;
                local_a34 = 0.0;
                oVar31 = (optional<float>)auStack_8f0;
                if ((optional<float>)auStack_8f0 == (optional<float>)0x0) {
                  oVar31 = (optional<float>)auStack_8e8;
                }
                pIVar25 = &local_730;
                lVar32 = 0;
                do {
                  iVar36 = (int)lVar32;
                  pfVar38 = (float *)local_798;
                  if ((iVar36 != 0) && (pfVar38 = (float *)(local_798 + 4), iVar36 != 1)) {
                    pfVar38 = &local_a34;
                  }
                  *pfVar38 = 0.0;
                  lVar39 = 0;
                  do {
                    pfVar38 = (float *)local_798;
                    if ((iVar36 != 0) && (pfVar38 = (float *)(local_798 + 4), iVar36 != 1)) {
                      pfVar38 = &local_a34;
                    }
                    auVar53 = vfmadd213ss_fma(ZEXT416(*(uint *)((long)oVar31 + lVar39 * 4)),
                                              ZEXT416(*(uint *)((long)&(pIVar25->alloc).
                                                                       memoryResource + lVar39 * 4))
                                              ,ZEXT416((uint)*pfVar38));
                    *pfVar38 = auVar53._0_4_;
                    lVar39 = lVar39 + 1;
                  } while (lVar39 != 3);
                  lVar32 = lVar32 + 1;
                  pIVar25 = (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)
                            ((long)&pIVar25->ptr + 4);
                } while (lVar32 != 3);
                pIStack_790._0_4_ = local_a34;
                values.n = 3;
                values.ptr = (float *)local_798;
                pbrt::Image::SetChannels
                          ((Image *)&local_680.__align,PVar46,(ImageChannelDesc *)&local_a90,values)
                ;
                auStack_8d8._8_8_ = 0;
                (**(code **)(*(long *)local_8f8 + 0x18))
                          (local_8f8,auStack_8f0,auStack_8d8._0_8_ << 2,4);
                uVar42 = uVar42 + 1;
              } while (uVar42 != (local_ae0 & 0x7fffffff));
            }
            local_af8 = (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)
                        ((long)local_af8 + 1);
          } while (local_af8 !=
                   (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)uVar22);
        }
        local_2b8 = '\x01';
        local_2c0 = to;
      }
      local_a90.nStored = 0;
      (**(code **)(((_Alloc_hider *)&(local_a90.alloc.memoryResource)->_vptr_memory_resource)->_M_p
                  + 0x18))(local_a90.alloc.memoryResource,local_a90.ptr,local_a90.nAlloc << 2,4);
      if (sVar43 != 0) goto LAB_001f8150;
    }
  }
  else {
    str._M_str = (char *)0x2c;
    str._M_len = (size_t)local_7b8._M_dataplus._M_p;
    pbrt::SplitString_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_730,(pbrt *)local_7b8._M_string_length,str,ch);
    requestedChannels.n = (long)local_730.ptr - (long)local_730.alloc.memoryResource >> 5;
    requestedChannels.ptr =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         local_730.alloc.memoryResource;
    pbrt::Image::GetChannelDesc
              ((ImageChannelDesc *)&local_a90,(Image *)&local_680.__align,requestedChannels);
    sVar43 = local_a90.nStored;
    if (local_a90.nStored == 0) {
      fprintf(_stderr,"%s: image doesn\'t have channels \"%s\".\n",local_750._M_dataplus._M_p,
              local_7b8._M_dataplus._M_p);
    }
    else {
      AVar21.memoryResource = pstd::pmr::new_delete_resource();
      pbrt::Image::SelectChannels
                ((Image *)local_8f8,(Image *)&local_680.__align,(ImageChannelDesc *)&local_a90,
                 AVar21);
      local_678 = (aligned_storage_t<sizeof(float),_alignof(float)>)auStack_8f0._0_4_;
      local_680 = local_8f8._0_4_;
      uStack_67c = local_8f8._4_4_;
      pbrt::
      InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(&local_670,
                  (InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)auStack_8e8);
      local_5d0 = oStack_848;
      pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::operator=
                ((vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *)
                 auStack_5c8,
                 (vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *)
                 auStack_840);
      pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::operator=
                ((vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *)local_5a8,
                 (vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *)&pStack_820);
      pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=
                (&local_588,&vStack_800);
      vStack_800.nStored = 0;
      (*(vStack_800.alloc.memoryResource)->_vptr_memory_resource[3])
                (vStack_800.alloc.memoryResource,vStack_800.ptr,vStack_800.nAlloc << 2,4);
      p_Stack_808 = (_Base_ptr)0x0;
      (*(pStack_820.memoryResource)->_vptr_memory_resource[3])
                (pStack_820.memoryResource,p_Stack_818,(long)p_Stack_810 * 2,2);
      auStack_828 = (undefined1  [8])0x0;
      (*(*(_func_int ***)auStack_840)[3])(auStack_840,local_838,uStack_830,1);
      pbrt::
      InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~InlinedVector((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)auStack_8e8);
    }
    local_a90.nStored = 0;
    (**(code **)(((_Alloc_hider *)&(local_a90.alloc.memoryResource)->_vptr_memory_resource)->_M_p +
                0x18))(local_a90.alloc.memoryResource,local_a90.ptr,local_a90.nAlloc << 2,4);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_730);
    if (sVar43 != 0) goto LAB_001f7acb;
  }
  uVar30 = 1;
LAB_001f9733:
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               *)local_2b0);
  if (local_2b8 == '\x01') {
    local_2b8 = '\0';
  }
  if (local_2c4 == '\x01') {
    local_2c4 = '\0';
  }
  if (local_2cc == '\x01') {
    local_2cc = '\0';
  }
  if (local_2d4 == '\x01') {
    local_2d4 = '\0';
  }
  if (local_2e0 == '\x01') {
    local_2e0 = '\0';
  }
  if (local_2f4 == '\x01') {
    local_2f4 = '\0';
  }
  if (local_338 == '\x01') {
    local_338 = '\0';
  }
  if (local_37c == '\x01') {
    local_37c = '\0';
  }
  local_588.nStored = 0;
  (*(local_588.alloc.memoryResource)->_vptr_memory_resource[3])
            (local_588.alloc.memoryResource,local_588.ptr,local_588.nAlloc << 2,4);
  local_590 = 0;
  (*(*(_func_int ***)local_5a8._0_8_)[3])(local_5a8._0_8_,local_5a8._8_8_,sStack_598 * 2,2);
  local_5b0 = 0;
  (*(*(_func_int ***)auStack_5c8._0_8_)[3])(auStack_5c8._0_8_,auStack_5c8._8_8_,sStack_5b8,1);
  pbrt::
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~InlinedVector(&local_670);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::~_Rb_tree(&local_78);
  if (local_80 == true) {
    local_80 = false;
  }
  if (local_8c == true) {
    local_8c = false;
  }
  if (local_94 == true) {
    local_94 = false;
  }
  if (local_9c == true) {
    local_9c = false;
  }
  if (local_a8 == true) {
    local_a8 = false;
  }
  if (local_bc == true) {
    local_bc = false;
  }
  if (local_100 == true) {
    local_100 = false;
  }
  if (local_144 == true) {
    local_144 = false;
  }
  sStack_150 = 0;
  (*(local_168.memoryResource)->_vptr_memory_resource[3])
            (local_168.memoryResource,local_160,sStack_158 << 2,4);
  sStack_170 = 0;
  (*(local_188.memoryResource)->_vptr_memory_resource[3])
            (local_188.memoryResource,local_180._0_8_,local_180._8_8_ * 2,2);
  sStack_190 = 0;
  (*(pStack_1a8.memoryResource)->_vptr_memory_resource[3])
            (pStack_1a8.memoryResource,local_1a0._0_8_,local_1a0._8_8_,1);
  pbrt::
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~InlinedVector(&local_250);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7b8._M_dataplus._M_p != &local_7b8.field_2) {
    operator_delete(local_7b8._M_dataplus._M_p,
                    CONCAT71(local_7b8.field_2._M_allocated_capacity._1_7_,
                             local_7b8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6c0._M_dataplus._M_p != &local_6c0.field_2) {
    operator_delete(local_6c0._M_dataplus._M_p,
                    CONCAT71(local_6c0.field_2._M_allocated_capacity._1_7_,
                             local_6c0.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6a0._M_dataplus._M_p != &local_6a0.field_2) {
    operator_delete(local_6a0._M_dataplus._M_p,
                    CONCAT71(local_6a0.field_2._M_allocated_capacity._1_7_,
                             local_6a0.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_750._M_dataplus._M_p != &local_750.field_2) {
    operator_delete(local_750._M_dataplus._M_p,
                    CONCAT71(local_750.field_2._M_allocated_capacity._1_7_,
                             local_750.field_2._M_local_buf[0]) + 1);
  }
  return uVar30;
}

Assistant:

int convert(int argc, char *argv[]) {
    bool acesFilmic = false;
    float scale = 1.f, gamma = 1.f;
    int repeat = 1;
    bool flipy = false;
    bool tonemap = false;
    Float maxY = 1.;
    Float despikeLimit = Infinity;
    bool preserveColors = false;
    bool bw = false;
    std::string inFile, outFile;
    std::string colorspace;
    std::string channelNames;
    std::array<int, 4> cropWindow = {-1, 0, -1, 0};

    while (*argv != nullptr) {
        auto onError = [](const std::string &err) {
            usage("convert", "%s", err.c_str());
            exit(1);
        };

        if (ParseArg(&argv, "acesfilmic", &acesFilmic, onError) ||
            ParseArg(&argv, "bw", &bw, onError) ||
            ParseArg(&argv, "channels", &channelNames, onError) ||
            ParseArg(&argv, "colorspace", &colorspace, onError) ||
            ParseArg(&argv, "crop", pstd::MakeSpan(cropWindow), onError) ||
            ParseArg(&argv, "despike", &despikeLimit, onError) ||
            ParseArg(&argv, "flipy", &flipy, onError) ||
            ParseArg(&argv, "gamma", &gamma, onError) ||
            ParseArg(&argv, "maxluminance", &maxY, onError) ||
            ParseArg(&argv, "outfile", &outFile, onError) ||
            ParseArg(&argv, "preservecolors", &preserveColors, onError) ||
            ParseArg(&argv, "repeatpix", &repeat, onError) ||
            ParseArg(&argv, "scale", &scale, onError) ||
            ParseArg(&argv, "tonemap", &tonemap, onError)) {
            // success
        } else if (argv[0][0] != '-' && inFile.empty()) {
            inFile = *argv;
            ++argv;
        } else
            usage("convert", "%s: unknown command flag", *argv);
    }

    if (maxY <= 0)
        usage("convert", "--maxluminance value must be greater than zero");
    if (repeat <= 0)
        usage("convert", "--repeatpix value must be greater than zero");
    if (scale == 0)
        usage("convert", "--scale value must be non-zero");
    if (outFile.empty())
        usage("convert", "--outfile filename must be specified");
    if (inFile.empty())
        usage("convert", "input filename not specified");

    ImageAndMetadata imRead = Image::Read(inFile);
    Image image = std::move(imRead.image);
    ImageMetadata metadata = std::move(imRead.metadata);

    if (channelNames.empty()) {
        // If the input image has AOVs and the target image is a regular
        // format, then just grab R,G,B...
        bool hasAOVs = false;
        for (const std::string &name : image.ChannelNames())
            if (name != "R" && name != "G" && name != "B" && name != "A") {
                hasAOVs = true;
                break;
            }

        if (hasAOVs && !HasExtension(outFile, "exr")) {
            fprintf(stderr,
                    "%s: image has non-RGB channels but converting to an "
                    "image format that can't store them. Converting RGB only.\n",
                    inFile.c_str());
            channelNames = "R,G,B";
        }
    }

    if (!channelNames.empty()) {
        std::vector<std::string> splitChannelNames = SplitString(channelNames, ',');
        ImageChannelDesc desc = image.GetChannelDesc(splitChannelNames);
        if (!desc) {
            fprintf(stderr, "%s: image doesn't have channels \"%s\".\n", inFile.c_str(),
                    channelNames.c_str());
            return 1;
        }
        image = image.SelectChannels(desc);
    }

    Point2i res = image.Resolution();
    int nc = image.NChannels();

    // Crop
    // If last 2 are negative, they're taken as deltas
    if (cropWindow[1] < 0)
        cropWindow[1] = cropWindow[0] - cropWindow[1];
    if (cropWindow[3] < 0)
        cropWindow[3] = cropWindow[2] - cropWindow[3];
    if (cropWindow[0] >= 0 && cropWindow[2] >= 0) {
        image = image.Crop(
            Bounds2i({cropWindow[0], cropWindow[2]}, {cropWindow[1], cropWindow[3]}));
        res = image.Resolution();
    }

    // Convert to a 32-bit format for maximum accuracy in the following
    // processing.
    if (!Is32Bit(image.Format()))
        image = image.ConvertToFormat(PixelFormat::Float);

    if (!colorspace.empty()) {
        const RGBColorSpace *dest = RGBColorSpace::GetNamed(colorspace);
        if (!dest) {
            fprintf(stderr, "%s: color space unknown.\n", colorspace.c_str());
            return 1;
        }
        ImageChannelDesc rgbDesc = image.GetChannelDesc({"R", "G", "B"});
        if (!rgbDesc) {
            fprintf(stderr, "%s: doesn't have R, G, B channels.\n", inFile.c_str());
            return 1;
        }

        const RGBColorSpace *srcColorSpace = (metadata.colorSpace && *metadata.colorSpace)
                                                 ? *metadata.colorSpace
                                                 : RGBColorSpace::sRGB;
        SquareMatrix<3> m = ConvertRGBColorSpace(*srcColorSpace, *dest);
        for (int y = 0; y < res.y; ++y)
            for (int x = 0; x < res.x; ++x) {
                ImageChannelValues channels = image.GetChannels({x, y}, rgbDesc);
                RGB rgb = Mul<RGB>(m, channels);
                image.SetChannels({x, y}, rgbDesc, {rgb.r, rgb.g, rgb.b});
            }
        metadata.colorSpace = dest;
    }

    if (bw) {
        for (int y = 0; y < res.y; ++y)
            for (int x = 0; x < res.x; ++x) {
                Float sum = 0;
                for (int c = 0; c < nc; ++c)
                    sum += image.GetChannel({x, y}, c);
                sum /= nc;
                for (int c = 0; c < nc; ++c)
                    image.SetChannel({x, y}, c, sum);
            }
    }

    if (despikeLimit < Infinity) {
        Image filteredImg = image;
        int despikeCount = 0;
        std::vector<ImageChannelValues> neighbors;
        for (int i = 0; i < 9; ++i)
            neighbors.push_back(ImageChannelValues(image.NChannels()));

        for (int y = 0; y < res.y; ++y) {
            for (int x = 0; x < res.x; ++x) {
                if (image.GetChannels({x, y}).Average() < despikeLimit)
                    continue;

                // Copy all of the valid neighbor pixels into neighbors[].
                ++despikeCount;
                int validNeighbors = 0;
                for (int dy = -1; dy <= 1; ++dy) {
                    if (y + dy < 0 || y + dy >= res.y)
                        continue;
                    for (int dx = -1; dx <= 1; ++dx) {
                        if (x + dx < 0 || x + dx > res.x)
                            continue;
                        neighbors[validNeighbors++] = image.GetChannels({x + dx, y + dy});
                    }
                }

                // Find the median of the neighbors, sorted by average value.
                int mid = validNeighbors / 2;
                std::nth_element(
                    &neighbors[0], &neighbors[mid], &neighbors[validNeighbors],
                    [](const ImageChannelValues &a, const ImageChannelValues &b) -> bool {
                        return a.Average() < b.Average();
                    });
                filteredImg.SetChannels({x, y}, neighbors[mid]);
            }
        }
        pstd::swap(image, filteredImg);
        fprintf(stderr, "%s: despiked %d pixels\n", inFile.c_str(), despikeCount);
    }

    if (scale != 1) {
        for (int y = 0; y < res.y; ++y)
            for (int x = 0; x < res.x; ++x)
                for (int c = 0; c < nc; ++c)
                    image.SetChannel({x, y}, c, scale * image.GetChannel({x, y}, c));
    }

    if (gamma != 1) {
        for (int y = 0; y < res.y; ++y)
            for (int x = 0; x < res.x; ++x)
                for (int c = 0; c < nc; ++c)
                    image.SetChannel(
                        {x, y}, c,
                        std::pow(std::max<Float>(0, image.GetChannel({x, y}, c)), gamma));
    }

    if (tonemap) {
        for (int y = 0; y < res.y; ++y)
            for (int x = 0; x < res.x; ++x) {
                Float lum = image.GetChannels({x, y}).Average();
                // Reinhard et al. photographic tone mapping operator.
                Float scale = (1 + lum / (maxY * maxY)) / (1 + lum);
                for (int c = 0; c < nc; ++c)
                    image.SetChannel({x, y}, c, scale * image.GetChannel({x, y}, c));
            }
    }

    if (preserveColors) {
        for (int y = 0; y < res.y; ++y)
            for (int x = 0; x < res.x; ++x) {
                Float m = image.GetChannel({x, y}, 0);
                for (int c = 1; c < nc; ++c)
                    m = std::max(m, image.GetChannel({x, y}, c));
                if (m > 1) {
                    for (int c = 0; c < nc; ++c)
                        image.SetChannel({x, y}, c, image.GetChannel({x, y}, c) / m);
                }
            }
    }

    if (acesFilmic) {
        // Approximation via
        // https://knarkowicz.wordpress.com/2016/01/06/aces-filmic-tone-mapping-curve/
        auto ACESFilm = [](Float x) -> Float {
            if (x <= 0)
                return 0;
            Float a = 2.51f;
            Float b = 0.03f;
            Float c = 2.43f;
            Float d = 0.59f;
            Float e = 0.14f;
            return Clamp((x * (a * x + b)) / (x * (c * x + d) + e), 0, 1);
        };

        for (int y = 0; y < res.y; ++y)
            for (int x = 0; x < res.x; ++x) {
                for (int c = 0; c < nc; ++c) {
                    Float v = image.GetChannel({x, y}, c);
                    v = ACESFilm(v);
                    image.SetChannel({x, y}, c, v);
                }
            }
    }

    if (repeat > 1) {
        Image scaledImage(image.Format(), Point2i(res.x * repeat, res.y * repeat),
                          image.ChannelNames(), image.Encoding());
        for (int y = 0; y < repeat * res.y; ++y) {
            int yy = y / repeat;
            for (int x = 0; x < repeat * res.x; ++x) {
                int xx = x / repeat;
                for (int c = 0; c < nc; ++c)
                    scaledImage.SetChannel({x, y}, c, image.GetChannel({xx, yy}, c));
            }
        }
        image = std::move(scaledImage);
        res = image.Resolution();
    }

    if (flipy)
        image.FlipY();

    if (!image.Write(outFile))
        return 1;

    return 0;
}